

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O0

void __thiscall MainWindow::trayIconContextMenu(MainWindow *this)

{
  undefined8 uVar1;
  sockaddr *psVar2;
  QAction *pQVar3;
  QSettings *pQVar4;
  QSystemTrayIcon *pQVar5;
  QObject local_118 [8];
  QKeySequence local_110 [8];
  QString local_108;
  QVariant local_f0;
  QString local_d0;
  QVariant local_b8;
  QKeySequence local_98 [8];
  QString local_90;
  QKeySequence local_78 [8];
  QString local_70;
  QFont local_58 [8];
  QFont boldFont;
  QKeySequence local_48 [8];
  QString local_40;
  sockaddr *local_18;
  QMenu *menu;
  MainWindow *this_local;
  
  menu = (QMenu *)this;
  psVar2 = (sockaddr *)operator_new(0x28);
  QMenu::QMenu((QMenu *)psVar2,(QWidget *)this);
  local_18 = psVar2;
  QString::QString(&local_40,"Show/Hide Main Window");
  QKeySequence::QKeySequence(local_48);
  pQVar3 = (QAction *)
           QMenu::addAction((QString *)psVar2,(QObject *)&local_40,(char *)this,
                            (QKeySequence *)"1showHideMainWindow()");
  this->trayIconMenuShowHideMainWindow = pQVar3;
  QKeySequence::~QKeySequence(local_48);
  QString::~QString(&local_40);
  QAction::font();
  QFont::setBold(local_58,true);
  QAction::setFont((QFont *)this->trayIconMenuShowHideMainWindow);
  psVar2 = local_18;
  QString::QString(&local_70,"Show/Hide Floating Display");
  QKeySequence::QKeySequence(local_78);
  pQVar3 = (QAction *)
           QMenu::addAction((QString *)psVar2,(QObject *)&local_70,(char *)this,
                            (QKeySequence *)"1showHideFloatingDisplay()");
  this->trayIconMenuShowHideFloatingDisplay = pQVar3;
  QKeySequence::~QKeySequence(local_78);
  QString::~QString(&local_70);
  psVar2 = local_18;
  QString::QString(&local_90,"Show MIDI Player");
  QKeySequence::QKeySequence(local_98);
  QMenu::addAction((QString *)psVar2,(QObject *)&local_90,(char *)this,
                   (QKeySequence *)"1on_actionPlay_MIDI_file_triggered()");
  QKeySequence::~QKeySequence(local_98);
  QString::~QString(&local_90);
  QWidget::addAction((QAction *)local_18);
  uVar1 = *(undefined8 *)(this->ui + 0x20);
  pQVar4 = Master::getSettings(this->master);
  QString::QString(&local_d0,"Master/startIconized");
  QVariant::QVariant(&local_f0,false);
  QSettings::value((QString *)&local_b8,(QVariant *)pQVar4);
  QVariant::toBool();
  QAction::setChecked(SUB81(uVar1,0));
  QVariant::~QVariant(&local_b8);
  QVariant::~QVariant(&local_f0);
  QString::~QString(&local_d0);
  psVar2 = local_18;
  QString::QString(&local_108,"Exit");
  QKeySequence::QKeySequence(local_110);
  QMenu::addAction((QString *)psVar2,(QObject *)&local_108,(char *)this,
                   (QKeySequence *)"1on_actionExit_triggered()");
  QKeySequence::~QKeySequence(local_110);
  QString::~QString(&local_108);
  QObject::connect(local_118,(int)this,local_18,0x1c74ff);
  QMetaObject::Connection::~Connection((Connection *)local_118);
  pQVar5 = Master::getTrayIcon(this->master);
  QSystemTrayIcon::setContextMenu((QMenu *)pQVar5);
  QFont::~QFont(local_58);
  return;
}

Assistant:

void MainWindow::trayIconContextMenu() {
	QMenu *menu = new QMenu(this);

	trayIconMenuShowHideMainWindow = menu->addAction("Show/Hide Main Window", this, SLOT(showHideMainWindow()));
	QFont boldFont(trayIconMenuShowHideMainWindow->font());
	boldFont.setBold(true);
	trayIconMenuShowHideMainWindow->setFont(boldFont);

	trayIconMenuShowHideFloatingDisplay = menu->addAction("Show/Hide Floating Display", this, SLOT(showHideFloatingDisplay()));

	menu->addAction("Show MIDI Player", this, SLOT(on_actionPlay_MIDI_file_triggered()));

	menu->addAction(ui->actionStart_iconized);
	ui->actionStart_iconized->setChecked(master->getSettings()->value("Master/startIconized", false).toBool());

#ifdef WITH_WINCONSOLE
	QAction *a = menu->addAction("Show console", this, SLOT(toggleShowConsole()));
	a->setCheckable(true);
	a->setChecked(master->getSettings()->value("Master/showConsole", false).toBool());
#endif

	menu->addAction("Exit", this, SLOT(on_actionExit_triggered()));

	connect(menu, SIGNAL(aboutToShow()), SLOT(handleTrayIconMenuAboutToShow()));
	master->getTrayIcon()->setContextMenu(menu);
}